

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

void dump_features(ang_file *fff)

{
  byte bVar1;
  wchar_t wVar2;
  feature *pfVar3;
  char *pcVar4;
  char *local_38;
  char *light;
  wint_t chr;
  uint8_t attr;
  size_t j;
  feature *feat;
  wchar_t i;
  ang_file *fff_local;
  
  feat._4_4_ = L'\0';
  do {
    if (L'\x18' < feat._4_4_) {
      return;
    }
    pfVar3 = f_info + feat._4_4_;
    if ((pfVar3->name != (char *)0x0) && (pfVar3->mimic == (feature *)0x0)) {
      file_putf(fff,"# Terrain: %s\n",pfVar3->name);
      for (_chr = 0; _chr < 4; _chr = _chr + 1) {
        bVar1 = feat_x_attr[_chr][feat._4_4_];
        wVar2 = feat_x_char[_chr][feat._4_4_];
        local_38 = "";
        if (_chr == 1) {
          local_38 = "torch";
        }
        if (_chr == 0) {
          local_38 = "los";
        }
        else if (_chr == 2) {
          local_38 = "lit";
        }
        else if (_chr == 3) {
          local_38 = "dark";
        }
        if (*local_38 == '\0') {
          __assert_fail("light[0]",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-prefs.c"
                        ,0x10c,"void dump_features(ang_file *)");
        }
        pcVar4 = get_feat_code_name(feat._4_4_);
        file_putf(fff,"feat:%s:%s:%d:%d\n",pcVar4,local_38,(ulong)bVar1,(ulong)(uint)wVar2);
      }
    }
    feat._4_4_ = feat._4_4_ + L'\x01';
  } while( true );
}

Assistant:

void dump_features(ang_file *fff)
{
	int i;

	for (i = 0; i < FEAT_MAX; i++) {
		struct feature *feat = &f_info[i];
		size_t j;

		/* Skip non-entries */
		if (!feat->name) continue;

		/* Skip mimic entries  */
		if (feat->mimic) continue;

		file_putf(fff, "# Terrain: %s\n", feat->name);
		for (j = 0; j < LIGHTING_MAX; j++) {
			uint8_t attr = feat_x_attr[j][i];
			wint_t chr = feat_x_char[j][i];

			const char *light = "";
			if (j == LIGHTING_TORCH)
				light = "torch";
			if (j == LIGHTING_LOS)
				light = "los";
			else if (j == LIGHTING_LIT)
				light = "lit";
			else if (j == LIGHTING_DARK)
				light = "dark";

			assert(light[0]);

			file_putf(fff, "feat:%s:%s:%d:%d\n",
				get_feat_code_name(i), light, attr, chr);
		}
	}
}